

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

int __thiscall
axl::sl::Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::copy
          (Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  bool bVar1;
  Hdr *pHVar2;
  EVP_PKEY_CTX *dst_00;
  EVP_PKEY_CTX *src_00;
  Hdr *hdr;
  ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *in_stack_ffffffffffffffc8;
  ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *in_stack_ffffffffffffffd0;
  int local_8;
  
  if (dst == (EVP_PKEY_CTX *)this) {
    local_8 = (int)(this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).
                   m_count;
  }
  else {
    bVar1 = ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::isEmpty
                      ((ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *)dst);
    if (bVar1) {
      clear((Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *)0x10d0ec);
      local_8 = 0;
    }
    else {
      pHVar2 = ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::getHdr
                         ((ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *)dst);
      if ((pHVar2 == (Hdr *)0x0) || ((pHVar2->m_flags & 4) != 0)) {
        dst_00 = (EVP_PKEY_CTX *)ArrayRef::operator_cast_to_unsigned_long_((ArrayRef *)dst);
        src_00 = (EVP_PKEY_CTX *)
                 ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::getCount
                           ((ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *)dst);
        local_8 = copy(this,dst_00,src_00);
      }
      else {
        ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::attach
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        local_8 = (int)(this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).
                       m_count;
      }
    }
  }
  return local_8;
}

Assistant:

size_t
	copy(const ArrayRef& src) {
		if (&src == this)
			return this->m_count;

		if (src.isEmpty()) {
			clear();
			return 0;
		}

		Hdr* hdr = src.getHdr();
		if (!hdr || (hdr->m_flags & rc::BufHdrFlag_Exclusive))
			return copy(src, src.getCount());

		this->attach(src);
		return this->m_count;
	}